

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

Handle __thiscall soul::Value::getStringLiteral(Value *this)

{
  PackedData local_20;
  
  getData(&local_20,this);
  if (local_20.size == 4) {
    return (Handle)*(uint32_t *)local_20.data;
  }
  throwInternalCompilerError("size == sizeof (Primitive)","getAs",0x15e);
}

Assistant:

StringDictionary::Handle Value::getStringLiteral() const    { return getData().getAs<StringDictionary::Handle>(); }